

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_status_t linear_hash_update(ion_key_t key,ion_value_t value,linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  ion_key_size_t iVar2;
  ion_dictionary_compare_t p_Var3;
  byte bVar4;
  char cVar5;
  ion_status_t iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ion_fpos_t iVar12;
  long lVar13;
  ion_byte_t *key_00;
  int iVar14;
  undefined8 uStack_70;
  ion_byte_t aiStack_68 [8];
  undefined1 local_60 [8];
  linear_hash_bucket_t bucket;
  ulong local_40;
  ion_byte_t local_31 [8];
  ion_byte_t record_status;
  
  iVar14 = (linear_hash->super).record.key_size;
  if (iVar14 < 2) {
    uVar10 = 0;
    if (linear_hash->next_split < 1) goto LAB_00111404;
    iVar14 = linear_hash->initial_size;
  }
  else {
    uVar9 = (ulong)(iVar14 - 1);
    uVar8 = 0;
    uVar10 = 0;
    iVar14 = 3;
    do {
      pbVar1 = (byte *)((long)key + uVar8);
      lVar7 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      uVar10 = uVar10 + (key_bytes_to_int::coefficients[lVar7] - iVar14) * (uint)*pbVar1;
      iVar14 = key_bytes_to_int::coefficients[lVar7];
    } while (uVar9 != uVar8);
    iVar14 = linear_hash->initial_size;
    uVar10 = iVar14 - 1U & uVar10;
    if (linear_hash->next_split <= (int)uVar10) goto LAB_00111404;
    uVar8 = 0;
    uVar10 = 0;
    iVar11 = 3;
    do {
      pbVar1 = (byte *)((long)key + uVar8);
      lVar7 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      uVar10 = uVar10 + (key_bytes_to_int::coefficients[lVar7] - iVar11) * (uint)*pbVar1;
      iVar11 = key_bytes_to_int::coefficients[lVar7];
    } while (uVar9 != uVar8);
  }
  uVar10 = uVar10 & iVar14 * 2 - 1U;
LAB_00111404:
  iVar12 = -1;
  if ((int)uVar10 < linear_hash->bucket_map->current_size) {
    iVar12 = linear_hash->bucket_map->data[(int)uVar10];
  }
  uStack_70 = 0x11142d;
  bVar4 = linear_hash_get_bucket(iVar12,(linear_hash_bucket_t *)local_60,linear_hash);
  if (bVar4 == 0) {
    key_00 = aiStack_68 + -((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    lVar7 = (long)key_00 -
            ((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    local_31[0] = '\0';
    local_40 = 0;
    bucket.overflow_location = lVar7;
    do {
      if (0 < linear_hash->records_per_bucket) {
        lVar13 = iVar12 + 0x10;
        iVar14 = 0;
        do {
          iVar12 = bucket.overflow_location;
          *(undefined8 *)(lVar7 + -8) = 0x111498;
          iVar6.error = linear_hash_get_record
                                  (lVar13,key_00,(ion_byte_t *)iVar12,local_31,linear_hash);
          iVar6._1_7_ = 0;
          if (iVar6.error != 0) goto LAB_00111504;
          if (local_31[0] == '\x01') {
            iVar2 = (linear_hash->super).record.key_size;
            p_Var3 = (linear_hash->super).compare;
            *(undefined8 *)(lVar7 + -8) = 0x1114ae;
            cVar5 = (*p_Var3)(key_00,key,iVar2);
            if (cVar5 == '\0') {
              *(undefined8 *)(lVar7 + -8) = 0x1114c8;
              iVar6.error = linear_hash_write_record
                                      (lVar13,key_00,(ion_byte_t *)value,local_31,linear_hash);
              iVar6._1_7_ = 0;
              if (iVar6.error != 0) goto LAB_00111504;
              local_40 = (ulong)((int)local_40 + 1);
            }
          }
          lVar13 = lVar13 + linear_hash->record_total_size;
          iVar14 = iVar14 + 1;
        } while (iVar14 < linear_hash->records_per_bucket);
      }
      iVar12 = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        iVar6.error = '\0';
        iVar6._1_3_ = 0;
        iVar6.count = 0;
        uVar10 = 0;
        if ((int)local_40 == 0) {
          iVar14 = (linear_hash->super).record.key_size;
          if (1 < iVar14) {
            uVar9 = 0;
            uVar10 = 0;
            iVar11 = 3;
            do {
              pbVar1 = (byte *)((long)key + uVar9);
              lVar13 = uVar9 + 1;
              uVar9 = uVar9 + 1;
              uVar10 = uVar10 + (key_bytes_to_int::coefficients[lVar13] - iVar11) * (uint)*pbVar1;
              iVar11 = key_bytes_to_int::coefficients[lVar13];
            } while (iVar14 - 1 != uVar9);
          }
          iVar14 = linear_hash->initial_size;
          *(undefined8 *)(lVar7 + -8) = 0x111586;
          iVar6 = linear_hash_insert(key,value,iVar14 - 1U & uVar10,linear_hash);
          local_40 = (ulong)iVar6 >> 0x20;
          uVar9 = (ulong)(iVar6._0_4_ & 0xffffff00);
        }
        else {
          uVar9 = 0;
        }
        goto LAB_0011150a;
      }
      *(undefined8 *)(lVar7 + -8) = 0x1114fc;
      iVar6.error = linear_hash_get_bucket(iVar12,(linear_hash_bucket_t *)local_60,linear_hash);
      iVar6._1_7_ = 0;
    } while (iVar6.error == 0);
LAB_00111504:
    uVar9 = 0;
LAB_0011150a:
    bVar4 = iVar6.error;
    uVar9 = local_40 << 0x20 | uVar9;
  }
  else {
    uVar9 = 0;
  }
  return (ion_status_t)(bVar4 | uVar9);
}

Assistant:

ion_status_t
linear_hash_update(
	ion_key_t			key,
	ion_value_t			value,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a temporary store for records that are read */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	ion_fpos_t record_loc;

	int				i;
	ion_boolean_t	terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			status.error = linear_hash_get_record(record_loc, record_key, record_value, &record_status, linear_hash);

			if (status.error != err_ok) {
				return status;
			}

			if (record_status == linear_hash_record_status_full) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.error = linear_hash_write_record(record_loc, record_key, value, &record_status, linear_hash);

					if (status.error != err_ok) {
						return status;
					}

					status.count++;
				}
			}

			record_loc += linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
		return linear_hash_insert(key, value, insert_hash_to_bucket(key, linear_hash), linear_hash);
	}
	else {
		status.error = err_ok;
	}

	return status;
}